

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void __thiscall features::Sift::extrema_detection(Sift *this)

{
  long lVar1;
  pointer pKVar2;
  pointer psVar3;
  pointer pOVar4;
  ImageVector *pIVar5;
  long lVar6;
  ulong uVar7;
  element_type *peStack_70;
  undefined1 local_68 [8];
  ConstPtr samples [3];
  
  pKVar2 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar2) {
    (this->keypoints).
    super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>._M_impl.
    super__Vector_impl_data._M_finish = pKVar2;
  }
  pOVar4 = (this->octaves).
           super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar4) {
    uVar7 = 0;
    do {
      if (2 < (int)((ulong)((long)pOVar4[uVar7].dog.
                                  super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pOVar4[uVar7].dog.
                                 super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        pIVar5 = &pOVar4[uVar7].dog;
        lVar6 = 0;
        do {
          psVar3 = (pIVar5->
                   super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_68 = (undefined1  [8])
                     psVar3[lVar6].
                     super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          samples[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 psVar3[lVar6].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[0].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[0].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
            }
          }
          lVar1 = lVar6 + 1;
          psVar3 = (pIVar5->
                   super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          samples[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               psVar3[lVar1].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          samples[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 psVar3[lVar1].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[1].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[1].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
            }
          }
          psVar3 = (pIVar5->
                   super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          samples[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               psVar3[lVar6 + 2].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 psVar3[lVar6 + 2].
                 super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[2].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              samples[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   samples[2].
                   super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->_M_use_count + 1;
            }
          }
          peStack_70 = (element_type *)0x11bc66;
          extrema_detection(this,(ConstPtr *)local_68,(this->options).min_octave + (int)uVar7,
                            (int)lVar6);
          lVar6 = 0x30;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_70 + lVar6) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              peStack_70 = (element_type *)0x11bc7b;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)&peStack_70 + lVar6));
            }
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
          lVar6 = lVar1;
        } while (lVar1 < ((long)pOVar4[uVar7].dog.
                                super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pIVar5->
                               super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) * 0x10000000 +
                         -0x200000000 >> 0x20);
      }
      uVar7 = uVar7 + 1;
      pOVar4 = (this->octaves).
               super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(this->octaves).
                                    super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void
Sift::extrema_detection (void)
{
    /* Delete previous keypoints. */
    this->keypoints.clear();

    /* Detect keypoints in each octave... */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
    {
        Octave const& oct(this->octaves[i]);
        /* In each octave, take three subsequent DoG images and detect. */
        for (int s = 0; s < (int)oct.dog.size() - 2; ++s)
        {
            core::FloatImage::ConstPtr samples[3] =
            { oct.dog[s + 0], oct.dog[s + 1], oct.dog[s + 2] };
            this->extrema_detection(samples, static_cast<int>(i)
                + this->options.min_octave, s);
        }
    }
}